

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ini_file.cxx
# Opt level: O2

bool __thiscall xray_re::xr_ini_file::parse(xr_ini_file *this,char *p,char *end,char *path)

{
  _Alloc_hider *p_Var1;
  string *psVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  __normal_iterator<xray_re::xr_ini_file::ini_item_**,_std::vector<xray_re::xr_ini_file::ini_item_*,_std::allocator<xray_re::xr_ini_file::ini_item_*>_>_>
  __position;
  ini_item *piVar6;
  __normal_iterator<xray_re::xr_ini_file::ini_section_**,_std::vector<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>_>
  _Var7;
  ini_section *piVar8;
  string *extension_00;
  char *format;
  string *local_200;
  uint local_1f4;
  ini_section *section;
  pointer local_1e8;
  ini_item *item;
  string name;
  string fname;
  string extension;
  string folder;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  char temp [256];
  
  folder._M_dataplus._M_p = (pointer)&folder.field_2;
  folder._M_string_length = 0;
  fname._M_dataplus._M_p = (pointer)&fname.field_2;
  fname._M_string_length = 0;
  folder.field_2._M_local_buf[0] = '\0';
  fname.field_2._M_local_buf[0] = '\0';
  extension._M_dataplus._M_p = (pointer)&extension.field_2;
  extension._M_string_length = 0;
  extension.field_2._M_local_buf[0] = '\0';
  extension_00 = &extension;
  local_200 = (string *)p;
  xr_file_system::split_path(path,&folder,&fname,extension_00);
  std::__cxx11::string::append((string *)&fname);
  local_1e8 = fname._M_dataplus._M_p;
  section = (ini_section *)0x0;
  name._M_dataplus._M_p = (pointer)&name.field_2;
  name._M_string_length = 0;
  name.field_2._M_local_buf[0] = '\0';
  local_1f4 = 1;
  do {
    iVar4 = skip_blank((char **)&local_200,end);
    psVar2 = local_200;
    extension_00 = (string *)
                   CONCAT71((int7)((ulong)extension_00 >> 8),iVar4 == 0x101 || local_200 < end);
    if (iVar4 != 0x101 && local_200 >= end) {
      __assert_fail("p < end || c == IF_EOF",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ini_file.cxx"
                    ,0x113,
                    "bool xray_re::xr_ini_file::parse(const char *, const char *, const char *)");
    }
    if (iVar4 == 0x5b) {
      local_200 = (string *)((long)&(local_200->_M_dataplus)._M_p + 1);
      iVar4 = read_name((char **)&local_200,end,(size_t)temp,(char *)extension_00);
      if ((iVar4 != 0x5d) || (temp[0] == '\0')) {
        format = "bad section header at %s:%u";
LAB_0015622b:
        bVar3 = false;
        msg(format,local_1e8,(ulong)local_1f4);
        goto LAB_00156264;
      }
      _Var7 = lower_bound_if<__gnu_cxx::__normal_iterator<xray_re::xr_ini_file::ini_section**,std::vector<xray_re::xr_ini_file::ini_section*,std::allocator<xray_re::xr_ini_file::ini_section*>>>,xray_re::xr_ini_file::ini_section_pred>
                        ((__normal_iterator<xray_re::xr_ini_file::ini_section_**,_std::vector<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>_>
                          )(this->m_sections).
                           super__Vector_base<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                         (__normal_iterator<xray_re::xr_ini_file::ini_section_**,_std::vector<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>_>
                          )(this->m_sections).
                           super__Vector_base<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish,(ini_section_pred)temp);
      if ((_Var7._M_current !=
           (this->m_sections).
           super__Vector_base<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>
           ._M_impl.super__Vector_impl_data._M_finish) &&
         (iVar4 = strcasecmp(((*_Var7._M_current)->name)._M_dataplus._M_p,temp), iVar4 == 0)) {
        bVar3 = false;
        msg("duplicate section %s at %s:%u",temp,local_1e8,(ulong)local_1f4);
        goto LAB_00156264;
      }
      piVar8 = (ini_section *)operator_new(0x38);
      ini_section::ini_section(piVar8,temp);
      section = piVar8;
      std::
      vector<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>
      ::insert(&this->m_sections,(const_iterator)_Var7._M_current,&section);
      local_200 = (string *)((long)&(local_200->_M_dataplus)._M_p + 1);
      iVar4 = skip_blank((char **)&local_200,end);
      if (iVar4 == 0x3a) {
        do {
          local_200 = (string *)((long)&(local_200->_M_dataplus)._M_p + 1);
          iVar4 = read_name((char **)&local_200,end,(size_t)temp,(char *)extension_00);
          _Var7 = lower_bound_if<__gnu_cxx::__normal_iterator<xray_re::xr_ini_file::ini_section**,std::vector<xray_re::xr_ini_file::ini_section*,std::allocator<xray_re::xr_ini_file::ini_section*>>>,xray_re::xr_ini_file::ini_section_pred>
                            ((__normal_iterator<xray_re::xr_ini_file::ini_section_**,_std::vector<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>_>
                              )(this->m_sections).
                               super__Vector_base<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>
                               ._M_impl.super__Vector_impl_data._M_start,
                             (__normal_iterator<xray_re::xr_ini_file::ini_section_**,_std::vector<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>_>
                              )(this->m_sections).
                               super__Vector_base<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish,(ini_section_pred)temp);
          if (_Var7._M_current ==
              (this->m_sections).
              super__Vector_base<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
LAB_001560aa:
            extension_00 = (string *)(ulong)local_1f4;
            msg("bad section reference \'%s\' at %s:%u",temp,local_1e8,extension_00);
            break;
          }
          piVar8 = *_Var7._M_current;
          iVar5 = strcasecmp((piVar8->name)._M_dataplus._M_p,temp);
          if (iVar5 != 0) goto LAB_001560aa;
          ini_section::merge(section,piVar8);
        } while (iVar4 == 0x2c);
      }
    }
    else {
      if ((iVar4 == 0xd) || (iVar4 == 10)) {
        __assert_fail("c != \'\\n\' && c != \'\\r\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ini_file.cxx"
                      ,0x114,
                      "bool xray_re::xr_ini_file::parse(const char *, const char *, const char *)");
      }
      if (iVar4 - 0x102U < 0xfffffffe) {
        bVar3 = is_name(iVar4);
        if (bVar3) {
          if (section == (ini_section *)0x0) {
            msg("item without section at %s:%u",local_1e8,(ulong)local_1f4);
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ini_file.cxx"
                          ,0x136,
                          "bool xray_re::xr_ini_file::parse(const char *, const char *, const char *)"
                         );
          }
          extension_00 = (string *)0x0;
          iVar4 = read_item((char **)&local_200,end,&name,true);
          __position = lower_bound_if<__gnu_cxx::__normal_iterator<xray_re::xr_ini_file::ini_item**,std::vector<xray_re::xr_ini_file::ini_item*,std::allocator<xray_re::xr_ini_file::ini_item*>>>,xray_re::xr_ini_file::ini_item_pred>
                                 ((__normal_iterator<xray_re::xr_ini_file::ini_item_**,_std::vector<xray_re::xr_ini_file::ini_item_*,_std::allocator<xray_re::xr_ini_file::ini_item_*>_>_>
                                   )(section->items).
                                    super__Vector_base<xray_re::xr_ini_file::ini_item_*,_std::allocator<xray_re::xr_ini_file::ini_item_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                  (__normal_iterator<xray_re::xr_ini_file::ini_item_**,_std::vector<xray_re::xr_ini_file::ini_item_*,_std::allocator<xray_re::xr_ini_file::ini_item_*>_>_>
                                   )(section->items).
                                    super__Vector_base<xray_re::xr_ini_file::ini_item_*,_std::allocator<xray_re::xr_ini_file::ini_item_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish,
                                  (ini_item_pred)name._M_dataplus._M_p);
          if (__position._M_current ==
              (section->items).
              super__Vector_base<xray_re::xr_ini_file::ini_item_*,_std::allocator<xray_re::xr_ini_file::ini_item_*>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
LAB_00155f77:
            piVar6 = (ini_item *)operator_new(0x40);
            ini_item::ini_item(piVar6,&name);
            item = piVar6;
            std::
            vector<xray_re::xr_ini_file::ini_item_*,_std::allocator<xray_re::xr_ini_file::ini_item_*>_>
            ::insert(&section->items,(const_iterator)__position._M_current,&item);
            piVar6 = item;
          }
          else {
            piVar6 = *__position._M_current;
            iVar5 = strcasecmp((piVar6->name)._M_dataplus._M_p,name._M_dataplus._M_p);
            if (iVar5 != 0) goto LAB_00155f77;
          }
          item = piVar6;
          if (iVar4 == 0x3d) {
            local_200 = (string *)((long)&(local_200->_M_dataplus)._M_p + 1);
            extension_00 = (string *)0x0;
            iVar4 = read_item((char **)&local_200,end,&item->value,false);
          }
          else {
            (item->value)._M_string_length = 0;
            *(item->value)._M_dataplus._M_p = '\0';
          }
        }
        else if (iVar4 == 0x23) {
          local_200 = (string *)((long)&(psVar2->_M_dataplus)._M_p + 1);
          iVar4 = read_name((char **)&local_200,end,(size_t)temp,(char *)extension_00);
          if ((iVar4 != 0x22) || (CONCAT71(temp._1_7_,temp[0]) != 0x6564756c636e69)) {
            bVar3 = false;
            msg("bad directive %s at %s:%u",temp,local_1e8,(ulong)local_1f4);
            goto LAB_00156264;
          }
          local_200 = (string *)((long)&(local_200->_M_dataplus)._M_p + 1);
          iVar4 = read_name((char **)&local_200,end,(size_t)temp,(char *)extension_00);
          if ((iVar4 != 0x22) || (temp[0] == '\0')) {
            format = "bad include at %s:%u";
            goto LAB_0015622b;
          }
          std::operator+(&local_158,&folder,temp);
          bVar3 = load_include(this,local_158._M_dataplus._M_p);
          std::__cxx11::string::~string((string *)&local_158);
          if (!bVar3) {
            bVar3 = false;
            goto LAB_00156264;
          }
          local_200 = (string *)((long)&(local_200->_M_dataplus)._M_p + 1);
          iVar4 = skip_blank((char **)&local_200,end);
        }
      }
    }
    if (iVar4 == 0x100) {
      local_200 = (string *)((long)&(local_200->_M_dataplus)._M_p + 1);
    }
    else {
      if (iVar4 == 0x101) {
        bVar3 = true;
LAB_00156264:
        std::__cxx11::string::~string((string *)&name);
        std::__cxx11::string::~string((string *)&extension);
        std::__cxx11::string::~string((string *)&fname);
        std::__cxx11::string::~string((string *)&folder);
        return bVar3;
      }
      msg("ignoring trailing garbage at %s:%u",local_1e8,(ulong)local_1f4);
      extension_00 = local_200;
      do {
        local_200 = (string *)end;
        if (extension_00 == (string *)end) break;
        local_200 = (string *)((long)&(extension_00->_M_dataplus)._M_p + 1);
        p_Var1 = &extension_00->_M_dataplus;
        extension_00 = local_200;
      } while (*(char *)&p_Var1->_M_p != '\n');
    }
    local_1f4 = local_1f4 + 1;
  } while( true );
}

Assistant:

bool xr_ini_file::parse(const char* p, const char* end, const char* path)
{
	std::string folder, fname, extension;
	xr_file_system::split_path(path, &folder, &fname, &extension);
	fname.append(extension);
	const char* file = fname.c_str();

	char temp[256];
	ini_section* section = 0;
	ini_item* item;
	std::string name;
	for (unsigned line = 1;; ++line) {
		int c = skip_blank(&p, end);
		xr_assert(p < end || c == IF_EOF);
		xr_assert(c != '\n' && c != '\r');
		if (c == '[') {
			++p;
			c = read_name(&p, end, sizeof(temp), temp);
			if (c != ']' || temp[0] == 0) {
				msg("bad section header at %s:%u", file, line);
				return false;
			}
			ini_section_vec_it it = lower_bound_if(m_sections.begin(), m_sections.end(), ini_section_pred(temp));
			if (it != m_sections.end() && xr_stricmp((*it)->name.c_str(), temp) == 0) {
				msg("duplicate section %s at %s:%u", temp, file, line);
				return false;
			}
			section = new ini_section(temp);
			m_sections.insert(it, section);
			++p;
			c = skip_blank(&p, end);
			if (c == ':') {
				for (;;) {
					++p;
					c = read_name(&p, end, sizeof(temp), temp);
					it = lower_bound_if(m_sections.begin(), m_sections.end(), ini_section_pred(temp));
					if (it == m_sections.end() || xr_stricmp((*it)->name.c_str(), temp) != 0) {
						msg("bad section reference '%s' at %s:%u", temp, file, line);
						break;
					}
					section->merge(*it);
					if (c != ',')
						break;
				}
			}
		} else if (c != IF_EOL && c != IF_EOF && is_name(c)) {
			if (section == 0) {
				msg("item without section at %s:%u", file, line);
				xr_not_expected();
			}
			c = read_item(&p, end, name, true);
			ini_item_vec_it it = lower_bound_if(section->begin(), section->end(), ini_item_pred(name.c_str()));
			if (it != section->end() && xr_stricmp((*it)->name.c_str(), name.c_str()) == 0) {
				item = *it;
			} else {
				item = new ini_item(name);
				section->items.insert(it, item);
			}
			if (c == '=') {
				++p;
				c = read_item(&p, end, item->value, false);
			} else {
				item->value.clear();
			}
		} else if (c == '#') {
			++p;
			c = read_name(&p, end, sizeof(temp), temp);
			if (c != '\"' || std::strcmp(temp, "include") != 0) {
				msg("bad directive %s at %s:%u", temp, file, line);
				return false;
			}
			++p;
			c = read_name(&p, end, sizeof(temp), temp);
			if (c != '\"' || temp[0] == 0) {
				msg("bad include at %s:%u", file, line);
				return false;
			}

			if (!load_include((folder + temp).c_str()))
				return false;

			++p;
			c = skip_blank(&p, end);
		}
		if (c == IF_EOF) {
			break;
		} else if (c != IF_EOL) {
			msg("ignoring trailing garbage at %s:%u", file, line);
			while (p != end) {
				if (*p++ == '\n')
					break;
			}
		} else {
			++p;
		}
	}
	return true;
}